

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Trigger * sqlite3TriggerList(Parse *pParse,Table *pTab)

{
  Schema *pSVar1;
  Trigger *pTVar2;
  Schema *pSVar3;
  Schema *pSVar4;
  int iVar5;
  HashElem *pHVar6;
  Trigger *local_38;
  
  pSVar1 = pParse->db->aDb[1].pSchema;
  pHVar6 = (HashElem *)&(pSVar1->trigHash).first;
  local_38 = pTab->pTrigger;
LAB_001a08ed:
  pHVar6 = pHVar6->next;
  if (pHVar6 == (HashElem *)0x0) {
    return local_38;
  }
  pTVar2 = (Trigger *)pHVar6->data;
  pSVar3 = pTVar2->pTabSchema;
  pSVar4 = pTab->pSchema;
  if ((((pSVar3 != pSVar4) || (pTVar2->table == (char *)0x0)) ||
      (iVar5 = sqlite3StrICmp(pTVar2->table,pTab->zName), iVar5 != 0)) || (pSVar3 == pSVar1))
  goto LAB_001a0908;
  goto LAB_001a091a;
LAB_001a0908:
  if (pTVar2->op == 0x96) {
    pTVar2->table = pTab->zName;
    pTVar2->pTabSchema = pSVar4;
LAB_001a091a:
    pTVar2->pNext = local_38;
    local_38 = pTVar2;
  }
  goto LAB_001a08ed;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggerList(Parse *pParse, Table *pTab){
  Schema *pTmpSchema;       /* Schema of the pTab table */
  Trigger *pList;           /* List of triggers to return */
  HashElem *p;              /* Loop variable for TEMP triggers */

  assert( pParse->disableTriggers==0 );
  pTmpSchema = pParse->db->aDb[1].pSchema;
  p = sqliteHashFirst(&pTmpSchema->trigHash);
  pList = pTab->pTrigger;
  while( p ){
    Trigger *pTrig = (Trigger *)sqliteHashData(p);
    if( pTrig->pTabSchema==pTab->pSchema
     && pTrig->table
     && 0==sqlite3StrICmp(pTrig->table, pTab->zName)
     && pTrig->pTabSchema!=pTmpSchema
    ){
      pTrig->pNext = pList;
      pList = pTrig;
    }else if( pTrig->op==TK_RETURNING ){
#ifndef SQLITE_OMIT_VIRTUALTABLE
      assert( pParse->db->pVtabCtx==0 );
#endif
      assert( pParse->bReturning );
      assert( &(pParse->u1.pReturning->retTrig) == pTrig );
      pTrig->table = pTab->zName;
      pTrig->pTabSchema = pTab->pSchema;
      pTrig->pNext = pList;
      pList = pTrig;
    }
    p = sqliteHashNext(p);
  }
#if 0
  if( pList ){
    Trigger *pX;
    printf("Triggers for %s:", pTab->zName);
    for(pX=pList; pX; pX=pX->pNext){
      printf(" %s", pX->zName);
    }
    printf("\n");
    fflush(stdout);
  }
#endif
  return pList;
}